

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doUnion
                 (IVal *a,IVal *b)

{
  bool *pbVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  undefined1 uVar7;
  IVal *ret;
  IVal *in_RDI;
  ulong uVar8;
  ulong uVar9;
  
  lVar6 = 8;
  do {
    *(undefined1 *)((long)in_RDI->m_data + lVar6 + -8) = 0;
    pbVar1 = &in_RDI->m_data[0].m_hasNaN + lVar6;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x50);
  lVar6 = 8;
  do {
    *(undefined1 *)((long)in_RDI->m_data + lVar6 + -8) = 0;
    pbVar1 = &in_RDI->m_data[0].m_hasNaN + lVar6;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x50);
  lVar6 = 8;
  do {
    uVar7 = 1;
    if (*(char *)((long)a->m_data + lVar6 + -8) == '\0') {
      uVar7 = (undefined1)*(undefined4 *)((long)b->m_data + lVar6 + -8);
    }
    *(undefined1 *)((long)in_RDI->m_data + lVar6 + -8) = uVar7;
    pbVar1 = &a->m_data[0].m_hasNaN + lVar6;
    dVar2 = *(double *)pbVar1;
    dVar3 = *(double *)(pbVar1 + 8);
    pbVar1 = &b->m_data[0].m_hasNaN + lVar6;
    dVar4 = *(double *)pbVar1;
    dVar5 = *(double *)(pbVar1 + 8);
    uVar8 = -(ulong)(dVar2 <= dVar4);
    uVar9 = -(ulong)(dVar5 <= dVar3);
    pbVar1 = &in_RDI->m_data[0].m_hasNaN + lVar6;
    *(ulong *)pbVar1 = ~uVar8 & (ulong)dVar4 | (ulong)dVar2 & uVar8;
    *(ulong *)(pbVar1 + 8) = ~uVar9 & (ulong)dVar5 | (ulong)dVar3 & uVar9;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x50);
  return in_RDI;
}

Assistant:

static IVal			doUnion			(const IVal& a, const IVal& b)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = unionIVal<Element>(a[ndx], b[ndx]);

		return ret;
	}